

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memutil.cc
# Opt level: O2

int absl::strings_internal::memcasecmp(char *s1,char *s2,size_t len)

{
  byte *pbVar1;
  byte *pbVar2;
  size_t i;
  
  i = 0;
  do {
    if (len == i) {
      return 0;
    }
    pbVar1 = (byte *)(s1 + i);
    pbVar2 = (byte *)(s2 + i);
    i = i + 1;
  } while ((uint)(byte)ascii_internal::kToLower[*pbVar1] -
           (uint)(byte)ascii_internal::kToLower[*pbVar2] == 0);
  return (uint)(byte)ascii_internal::kToLower[*pbVar1] -
         (uint)(byte)ascii_internal::kToLower[*pbVar2];
}

Assistant:

int memcasecmp(const char* s1, const char* s2, size_t len) {
  const unsigned char* us1 = reinterpret_cast<const unsigned char*>(s1);
  const unsigned char* us2 = reinterpret_cast<const unsigned char*>(s2);

  for (size_t i = 0; i < len; i++) {
    const int diff =
        int{static_cast<unsigned char>(absl::ascii_tolower(us1[i]))} -
        int{static_cast<unsigned char>(absl::ascii_tolower(us2[i]))};
    if (diff != 0) return diff;
  }
  return 0;
}